

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O0

int ElCompar(void *El1,void *El2)

{
  undefined4 local_1c;
  int Compar;
  void *El2_local;
  void *El1_local;
  
  local_1c = 0;
  if (*El1 < *El2) {
    local_1c = -1;
  }
  if (*El2 < *El1) {
    local_1c = 1;
  }
  return local_1c;
}

Assistant:

static int ElCompar(const void *El1, const void *El2)
/* compares positions of two matrix elements */
{
    int Compar;

    Compar = 0;
    if (((ElType *)El1)->Pos < ((ElType *)El2)->Pos)
        Compar = -1;
    if (((ElType *)El1)->Pos > ((ElType *)El2)->Pos)
        Compar = +1;

    return(Compar);
}